

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O2

void Bdc_SpfdDecomposeTest8(void)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Wrd_t *p;
  abctime aVar4;
  word wVar5;
  abctime time;
  abctime time_00;
  int i;
  int iVar6;
  word t;
  word FuncBest;
  Vec_Int_t *vWeights;
  
  t = 0x513b57150819050f;
  aVar3 = Abc_Clock();
  p = Bdc_SpfdReadFiles5(&vWeights);
  uVar1 = Bdc_SpfdAdjCost(0x513b57150819050f);
  i = 0;
  printf("Best init = %4d.  ",(ulong)uVar1);
  Extra_PrintHex(_stdout,(uint *)&t,6);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x7bf12a,(char *)(aVar4 - aVar3),time);
  iVar6 = p->nSize;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  uVar1 = 1000000000;
  for (; iVar6 != i; i = i + 1) {
    wVar5 = Vec_WrdEntry(p,i);
    uVar2 = Bdc_SpfdAdjCost(t ^ wVar5);
    if ((int)uVar2 < (int)uVar1) {
      uVar1 = uVar2;
      FuncBest = wVar5;
    }
  }
  printf("Best cost = %4d.  ",(ulong)uVar1);
  Extra_PrintHex(_stdout,(uint *)&FuncBest,6);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x7bf12a,(char *)(aVar4 - aVar3),time_00);
  Abc_Show6VarFunc(0,t);
  Abc_Show6VarFunc(0,FuncBest);
  Abc_Show6VarFunc(0,t ^ FuncBest);
  FuncBest = FuncBest ^ t;
  Extra_PrintHex(_stdout,(uint *)&FuncBest,6);
  putchar(10);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest8()
{
//    word t = 0x9ef7a8d9c7193a0f;
//    word t = 0x9EF7FDBFC77F6F0F;
    word t = ABC_CONST(0x513B57150819050F);

    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs;
    word Func, FuncBest;
    int Cost, CostBest = ABC_INFINITY;
    int i;
    abctime clk = Abc_Clock();

//    return;

    vDivs = Bdc_SpfdReadFiles5( &vWeights );

    printf( "Best init = %4d.  ", Bdc_SpfdAdjCost(t) );
    Extra_PrintHex( stdout, (unsigned *)&t, 6 ); //printf( "\n" );
    Abc_PrintTime( 1, "  Time", Abc_Clock() - clk );

    Vec_WrdForEachEntry( vDivs, Func, i )
    {
        Cost = Bdc_SpfdAdjCost( t ^ Func );
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            FuncBest = Func;
        }
    }

    printf( "Best cost = %4d.  ", CostBest );
    Extra_PrintHex( stdout, (unsigned *)&FuncBest, 6 ); //printf( "\n" );
    Abc_PrintTime( 1, "  Time", Abc_Clock() - clk );

Abc_Show6VarFunc( 0, t );
Abc_Show6VarFunc( 0, FuncBest );
Abc_Show6VarFunc( 0, (FuncBest ^ t) );

    FuncBest ^= t;
    Extra_PrintHex( stdout, (unsigned *)&FuncBest, 6 ); printf( "\n" );

}